

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_pmeth.c
# Opt level: O2

int pkey_gost_mac_keygen_base(EVP_PKEY_CTX *ctx,EVP_PKEY *pkey,int mac_nid)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  short *psVar4;
  undefined4 *key;
  
  psVar4 = (short *)EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)ctx);
  if ((psVar4 == (short *)0x0) || (*psVar4 == 0)) {
    ERR_GOST_error(0x82,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                   ,0x3a1);
  }
  else {
    key = (undefined4 *)
          CRYPTO_malloc(0x28,
                        "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_pmeth.c"
                        ,0x3a4);
    if (key != (undefined4 *)0x0) {
      uVar1 = *(undefined8 *)(psVar4 + 8);
      uVar2 = *(undefined8 *)(psVar4 + 0xc);
      uVar3 = *(undefined8 *)(psVar4 + 0x14);
      *(undefined8 *)(key + 5) = *(undefined8 *)(psVar4 + 0x10);
      *(undefined8 *)(key + 7) = uVar3;
      *(undefined8 *)(key + 1) = uVar1;
      *(undefined8 *)(key + 3) = uVar2;
      *key = *(undefined4 *)(psVar4 + 2);
      *(short *)(key + 9) = psVar4[1];
      EVP_PKEY_assign((EVP_PKEY *)pkey,mac_nid,key);
      return 1;
    }
  }
  return 0;
}

Assistant:

static int pkey_gost_mac_keygen_base(EVP_PKEY_CTX *ctx,
                                     EVP_PKEY *pkey, int mac_nid)
{
    struct gost_mac_pmeth_data *data = EVP_PKEY_CTX_get_data(ctx);
    struct gost_mac_key *keydata;
    if (!data || !data->key_set) {
        GOSTerr(GOST_F_PKEY_GOST_MAC_KEYGEN_BASE, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }
    keydata = OPENSSL_malloc(sizeof(struct gost_mac_key));
    if (keydata == NULL)
        return 0;
    memcpy(keydata->key, data->key, 32);
    keydata->mac_param_nid = data->mac_param_nid;
    keydata->mac_size = data->mac_size;
    EVP_PKEY_assign(pkey, mac_nid, keydata);
    return 1;
}